

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::mouse_pressed(Application *this,e_mouse_button b)

{
  e_mouse_button b_local;
  Application *this_local;
  
  if (b == LEFT) {
    this->leftDown = true;
  }
  else if (b == RIGHT) {
    this->rightDown = true;
  }
  else if (b == MIDDLE) {
    this->middleDown = true;
  }
  return;
}

Assistant:

void Application::mouse_pressed(e_mouse_button b) {
    switch (b) {
      case LEFT:
        leftDown = true;
        break;
      case RIGHT:
        rightDown = true;
        break;
      case MIDDLE:
        middleDown = true;
        break;
    }
}